

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_scatter_gather.cpp
# Opt level: O2

void duckdb::TupleDataStructScatter
               (Vector *source,TupleDataVectorFormat *source_format,SelectionVector *append_sel,
               idx_t append_count,TupleDataLayout *layout,Vector *row_locations,
               Vector *heap_locations,idx_t col_idx,UnifiedVectorFormat *dummy_arg,
               vector<duckdb::TupleDataScatterFunction,_true> *child_functions)

{
  byte *pbVar1;
  data_ptr_t pdVar2;
  SelectionVector *pSVar3;
  sel_t *psVar4;
  value_type vVar5;
  byte bVar6;
  bool bVar7;
  const_reference pvVar8;
  TupleDataLayout *pTVar9;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  const_reference this_00;
  type pVVar10;
  const_reference pvVar11;
  const_reference pvVar12;
  idx_t row_idx;
  idx_t i;
  idx_t iVar13;
  ulong __n;
  LogicalType local_b0;
  Vector struct_row_locations;
  
  pdVar2 = row_locations->data;
  if ((source_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
      (unsigned_long *)0x0) {
    pSVar3 = (source_format->unified).sel;
    bVar6 = (byte)col_idx & 7;
    for (iVar13 = 0; append_count != iVar13; iVar13 = iVar13 + 1) {
      row_idx = iVar13;
      if (append_sel->sel_vector != (sel_t *)0x0) {
        row_idx = (idx_t)append_sel->sel_vector[iVar13];
      }
      psVar4 = pSVar3->sel_vector;
      if (psVar4 != (sel_t *)0x0) {
        row_idx = (idx_t)psVar4[row_idx];
      }
      bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(source_format->unified).validity.
                          super_TemplatedValidityMask<unsigned_long>,row_idx);
      if (!bVar7) {
        struct_row_locations._0_8_ = *(undefined8 *)(pdVar2 + iVar13 * 8);
        struct_row_locations.type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (((long)(layout->types).
                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(layout->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x18);
        struct_row_locations.type.id_ = INVALID;
        struct_row_locations.type.physical_type_ = ~INVALID;
        struct_row_locations.type._2_6_ = 0;
        struct_row_locations.type.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        pbVar1 = (byte *)(struct_row_locations._0_8_ + (col_idx >> 3));
        *pbVar1 = *pbVar1 & (-2 << bVar6 | 0xfeU >> 8 - bVar6);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &struct_row_locations.type.type_info_);
      }
    }
  }
  LogicalType::LogicalType(&local_b0,POINTER);
  Vector::Vector(&struct_row_locations,&local_b0,append_count);
  LogicalType::~LogicalType(&local_b0);
  pvVar8 = vector<unsigned_long,_true>::get<true>(&layout->offsets,col_idx);
  vVar5 = *pvVar8;
  for (iVar13 = 0; append_count != iVar13; iVar13 = iVar13 + 1) {
    *(value_type *)(struct_row_locations.data + iVar13 * 8) = *(long *)(pdVar2 + iVar13 * 8) + vVar5
    ;
  }
  pTVar9 = TupleDataLayout::GetStructLayout(layout,col_idx);
  this = StructVector::GetEntries(source);
  InitializeValidityMask
            ((data_ptr_t *)struct_row_locations.data,append_count,
             ((long)(pTVar9->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(pTVar9->types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18 + 7U >> 3);
  for (__n = 0; __n < (ulong)(((long)(pTVar9->types).
                                     super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     .
                                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pTVar9->types).
                                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    .
                                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x18);
      __n = __n + 1) {
    this_00 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
              ::get<true>(this,__n);
    pVVar10 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        (this_00);
    pvVar11 = vector<duckdb::TupleDataVectorFormat,_true>::get<true>(&source_format->children,__n);
    pvVar12 = vector<duckdb::TupleDataScatterFunction,_true>::get<true>(child_functions,__n);
    (*pvVar12->function)
              (pVVar10,pvVar11,append_sel,append_count,pTVar9,&struct_row_locations,heap_locations,
               __n,dummy_arg,&pvVar12->child_functions);
  }
  Vector::~Vector(&struct_row_locations);
  return;
}

Assistant:

static void TupleDataStructScatter(const Vector &source, const TupleDataVectorFormat &source_format,
                                   const SelectionVector &append_sel, const idx_t append_count,
                                   const TupleDataLayout &layout, const Vector &row_locations, Vector &heap_locations,
                                   const idx_t col_idx, const UnifiedVectorFormat &dummy_arg,
                                   const vector<TupleDataScatterFunction> &child_functions) {
	// Source
	const auto &source_data = source_format.unified;
	const auto &source_sel = *source_data.sel;
	const auto &validity = source_data.validity;

	// Target
	const auto target_locations = FlatVector::GetData<data_ptr_t>(row_locations);

	// Precompute mask indexes
	idx_t entry_idx;
	idx_t idx_in_entry;
	ValidityBytes::GetEntryIndex(col_idx, entry_idx, idx_in_entry);

	// Set validity of the STRUCT in this layout
	if (!validity.AllValid()) {
		for (idx_t i = 0; i < append_count; i++) {
			const auto source_idx = source_sel.get_index(append_sel.get_index(i));
			if (!validity.RowIsValid(source_idx)) {
				ValidityBytes(target_locations[i], layout.ColumnCount()).SetInvalidUnsafe(entry_idx, idx_in_entry);
			}
		}
	}

	// Create a Vector of pointers to the TupleDataLayout of the STRUCT
	Vector struct_row_locations(LogicalType::POINTER, append_count);
	auto struct_target_locations = FlatVector::GetData<data_ptr_t>(struct_row_locations);
	const auto offset_in_row = layout.GetOffsets()[col_idx];
	for (idx_t i = 0; i < append_count; i++) {
		struct_target_locations[i] = target_locations[i] + offset_in_row;
	}

	const auto &struct_layout = layout.GetStructLayout(col_idx);
	auto &struct_sources = StructVector::GetEntries(source);
	D_ASSERT(struct_layout.ColumnCount() == struct_sources.size());

	// Set the validity of the entries within the STRUCTs
	InitializeValidityMask(struct_target_locations, append_count,
	                       ValidityBytes::SizeInBytes(struct_layout.ColumnCount()));

	// Recurse through the struct children
	for (idx_t struct_col_idx = 0; struct_col_idx < struct_layout.ColumnCount(); struct_col_idx++) {
		auto &struct_source = *struct_sources[struct_col_idx];
		const auto &struct_source_format = source_format.children[struct_col_idx];
		const auto &struct_scatter_function = child_functions[struct_col_idx];
		struct_scatter_function.function(struct_source, struct_source_format, append_sel, append_count, struct_layout,
		                                 struct_row_locations, heap_locations, struct_col_idx, dummy_arg,
		                                 struct_scatter_function.child_functions);
	}
}